

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

void __thiscall spv::Builder::promoteScalar(Builder *this,Decoration precision,Id *left,Id *right)

{
  uint scalar;
  pointer ppIVar1;
  int iVar2;
  int iVar3;
  Id IVar4;
  Id *pIVar5;
  
  iVar2 = getNumTypeConstituents
                    (this,(this->module).idToInstruction.
                          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[*right]->typeId);
  iVar3 = getNumTypeConstituents
                    (this,(this->module).idToInstruction.
                          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[*left]->typeId);
  pIVar5 = left;
  if ((iVar3 < iVar2) || (pIVar5 = right, right = left, iVar2 - iVar3 < 0)) {
    scalar = *pIVar5;
    ppIVar1 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    IVar4 = ppIVar1[scalar]->typeId;
    iVar2 = getNumTypeConstituents(this,ppIVar1[*right]->typeId);
    IVar4 = makeVectorType(this,IVar4,iVar2);
    IVar4 = smearScalar(this,precision,scalar,IVar4);
    *pIVar5 = IVar4;
  }
  return;
}

Assistant:

void Builder::promoteScalar(Decoration precision, Id& left, Id& right)
{
    int direction = getNumComponents(right) - getNumComponents(left);

    if (direction > 0)
        left = smearScalar(precision, left, makeVectorType(getTypeId(left), getNumComponents(right)));
    else if (direction < 0)
        right = smearScalar(precision, right, makeVectorType(getTypeId(right), getNumComponents(left)));

    return;
}